

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O0

void __thiscall ExecutionEngine::i_ddiv(ExecutionEngine *this)

{
  VMStack *this_00;
  Frame *this_01;
  ostream *this_02;
  Value VVar1;
  Value VVar2;
  undefined8 local_50;
  Value value_1;
  ValueType VStack_2c;
  Value value_2;
  Frame *topFrame;
  VMStack *stackFrame;
  ExecutionEngine *this_local;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  VVar1 = Frame::popTopOfOperandStack(this_01);
  Frame::popTopOfOperandStack(this_01);
  VVar2 = Frame::popTopOfOperandStack(this_01);
  VStack_2c = VVar1.type;
  if (VStack_2c != DOUBLE) {
    __assert_fail("value_2.type == ValueType::DOUBLE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0x8ac,"void ExecutionEngine::i_ddiv()");
  }
  local_50._4_4_ = VVar2.type;
  if (local_50._4_4_ == DOUBLE) {
    value_2._0_8_ = VVar1.data;
    if (((double)value_2._0_8_ == 0.0) && (!NAN((double)value_2._0_8_))) {
      this_02 = std::operator<<((ostream *)&std::cerr,"ArithmeticException");
      std::ostream::operator<<(this_02,std::endl<char,std::char_traits<char>>);
      exit(2);
    }
    value_1._0_8_ = VVar2.data;
    local_50 = VVar2._0_8_;
    VVar1.data.doubleValue = (double)value_1._0_8_ / (double)value_2._0_8_;
    VVar1.printType = (undefined4)local_50;
    VVar1.type = local_50._4_4_;
    Frame::pushIntoOperandStack(this_01,VVar1);
    this_01->pc = this_01->pc + 1;
    return;
  }
  __assert_fail("value_1.type == ValueType::DOUBLE",
                "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                ,0x8ad,"void ExecutionEngine::i_ddiv()");
}

Assistant:

void ExecutionEngine::i_ddiv() {
	VMStack &stackFrame = VMStack::getInstance();
	Frame *topFrame = stackFrame.getTopFrame();

	Value value_2 = topFrame->popTopOfOperandStack();
	topFrame->popTopOfOperandStack();
	Value value_1 = topFrame->popTopOfOperandStack();

	assert(value_2.type == ValueType::DOUBLE);
	assert(value_1.type == ValueType::DOUBLE);
	if (value_2.data.doubleValue == 0) {
		cerr << "ArithmeticException" << endl;
		exit(2);
	}
	value_1.data.doubleValue = value_1.data.doubleValue / (value_2.data.doubleValue);
	topFrame->pushIntoOperandStack(value_1);

	topFrame->pc += 1;
}